

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lubs.cpp
# Opt level: O1

LUBFinder wasm::LUB::getResultsLUB(Function *func,Module *wasm)

{
  bool bVar1;
  Function *pFVar2;
  Type a;
  PassRunner *pPVar3;
  PassRunner *pPVar4;
  Expression **root;
  char cVar5;
  Signature SVar6;
  ReFinalize local_188;
  Type local_48;
  Type targetType;
  Type local_38;
  Type originalType;
  
  a.id = 1;
  if (((wasm->features).features & 0x400) != 0) {
    SVar6 = HeapType::getSignature(&func->type);
    local_38 = SVar6.results.id;
    bVar1 = wasm::Type::hasPredicate<&(wasm::Type::isRef()const)>(&local_38);
    if (bVar1) {
      ReFinalize::ReFinalize(&local_188);
      root = &func->body;
      local_188.
      super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
      .super_PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>.
      super_Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>.currFunction
           = func;
      local_188.
      super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
      .super_PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>.
      super_Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>.currModule =
           wasm;
      Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::walk
                (&local_188.
                  super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
                  .
                  super_PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>
                  .super_Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>,
                 root);
      local_188.
      super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
      .super_PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>.
      super_Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>.currFunction
           = (Function *)0x0;
      local_188.
      super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
      .super_PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>.
      super_Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>.currModule =
           (Module *)0x0;
      local_188.
      super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
      .super_Pass._vptr_Pass = (_func_int **)&PTR__ReFinalize_00d870a0;
      std::
      _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&local_188.breakTypes._M_h);
      if (local_188.
          super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
          .super_PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>.
          super_Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>.stack.
          flexible.
          super__Vector_base<wasm::Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::Task,_std::allocator<wasm::Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::Task>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_188.
                        super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
                        .
                        super_PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>
                        .
                        super_Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>
                        .stack.flexible.
                        super__Vector_base<wasm::Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::Task,_std::allocator<wasm::Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::Task>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_188.
                              super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
                              .
                              super_PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>
                              .
                              super_Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>
                              .stack.flexible.
                              super__Vector_base<wasm::Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::Task,_std::allocator<wasm::Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::Task>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_188.
                              super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
                              .
                              super_PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>
                              .
                              super_Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>
                              .stack.flexible.
                              super__Vector_base<wasm::Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::Task,_std::allocator<wasm::Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::Task>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      local_188.
      super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
      .super_Pass._vptr_Pass = (_func_int **)&PTR__Pass_00d87048;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188.
             super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
             .super_Pass.name._M_dataplus._M_p !=
          &local_188.
           super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
           .super_Pass.name.field_2) {
        operator_delete(local_188.
                        super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
                        .super_Pass.name._M_dataplus._M_p,
                        local_188.
                        super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
                        .super_Pass.name.field_2._M_allocated_capacity + 1);
      }
      a = wasm::Type::getLeastUpperBound((Type)0x1,((*root)->type).id);
      if (a.id != local_38.id) {
        FindAll<wasm::Return>::FindAll((FindAll<wasm::Return> *)&local_188,*root);
        pPVar4 = local_188.
                 super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
                 .super_Pass.runner;
        for (pPVar3 = (PassRunner *)
                      local_188.
                      super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
                      .super_Pass._vptr_Pass; pPVar3 != pPVar4; pPVar3 = (PassRunner *)&pPVar3->wasm
            ) {
          a = wasm::Type::getLeastUpperBound(a,*(uintptr_t *)(pPVar3->_vptr_PassRunner[2] + 8));
          if (a.id == local_38.id) goto LAB_00a7606e;
        }
        if ((PassRunner *)
            local_188.
            super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
            .super_Pass._vptr_Pass != (PassRunner *)0x0) {
          operator_delete(local_188.
                          super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
                          .super_Pass._vptr_Pass,
                          (long)local_188.
                                super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
                                .super_Pass.name._M_dataplus._M_p -
                          (long)local_188.
                                super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
                                .super_Pass._vptr_Pass);
        }
        FindAll<wasm::Call>::FindAll((FindAll<wasm::Call> *)&local_188,*root);
        pPVar4 = local_188.
                 super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
                 .super_Pass.runner;
        for (pPVar3 = (PassRunner *)
                      local_188.
                      super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
                      .super_Pass._vptr_Pass; pPVar3 != pPVar4; pPVar3 = (PassRunner *)&pPVar3->wasm
            ) {
          if (*(code *)(pPVar3->_vptr_PassRunner + 8) == (code)0x1) {
            pFVar2 = Module::getFunction(wasm,(Name)((IString *)(pPVar3->_vptr_PassRunner + 6))->str
                                        );
            SVar6 = HeapType::getSignature(&pFVar2->type);
            a = wasm::Type::getLeastUpperBound(a,SVar6.results.id);
            if (a.id == local_38.id) goto LAB_00a7606e;
          }
        }
        if ((PassRunner *)
            local_188.
            super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
            .super_Pass._vptr_Pass != (PassRunner *)0x0) {
          operator_delete(local_188.
                          super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
                          .super_Pass._vptr_Pass,
                          (long)local_188.
                                super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
                                .super_Pass.name._M_dataplus._M_p -
                          (long)local_188.
                                super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
                                .super_Pass._vptr_Pass);
        }
        FindAll<wasm::CallIndirect>::FindAll((FindAll<wasm::CallIndirect> *)&local_188,*root);
        pPVar4 = local_188.
                 super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
                 .super_Pass.runner;
        for (pPVar3 = (PassRunner *)
                      local_188.
                      super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
                      .super_Pass._vptr_Pass; pPVar3 != pPVar4; pPVar3 = (PassRunner *)&pPVar3->wasm
            ) {
          if (*(code *)(pPVar3->_vptr_PassRunner + 10) == (code)0x1) {
            SVar6 = HeapType::getSignature((HeapType *)(pPVar3->_vptr_PassRunner + 2));
            a = wasm::Type::getLeastUpperBound(a,SVar6.results.id);
            if (a.id == local_38.id) goto LAB_00a7606e;
          }
        }
        if ((PassRunner *)
            local_188.
            super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
            .super_Pass._vptr_Pass != (PassRunner *)0x0) {
          operator_delete(local_188.
                          super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
                          .super_Pass._vptr_Pass,
                          (long)local_188.
                                super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
                                .super_Pass.name._M_dataplus._M_p -
                          (long)local_188.
                                super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
                                .super_Pass._vptr_Pass);
        }
        FindAll<wasm::CallRef>::FindAll((FindAll<wasm::CallRef> *)&local_188,*root);
        if ((PassRunner *)
            local_188.
            super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
            .super_Pass._vptr_Pass !=
            local_188.
            super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
            .super_Pass.runner) {
          pPVar4 = (PassRunner *)
                   local_188.
                   super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
                   .super_Pass._vptr_Pass;
          do {
            cVar5 = '\0';
            if (*(code *)(pPVar4->_vptr_PassRunner + 7) == (code)0x1) {
              local_48.id = *(uintptr_t *)(pPVar4->_vptr_PassRunner[6] + 8);
              cVar5 = '\t';
              if (local_48.id != 1) {
                targetType.id = (uintptr_t)wasm::Type::getHeapType(&local_48);
                SVar6 = HeapType::getSignature((HeapType *)&targetType);
                a = wasm::Type::getLeastUpperBound(a,SVar6.results.id);
                cVar5 = a.id == local_38.id;
              }
            }
          } while (((cVar5 == '\t') || (cVar5 == '\0')) &&
                  (pPVar4 = (PassRunner *)&pPVar4->wasm,
                  pPVar4 != local_188.
                            super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
                            .super_Pass.runner));
        }
LAB_00a7606e:
        if ((PassRunner *)
            local_188.
            super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
            .super_Pass._vptr_Pass != (PassRunner *)0x0) {
          operator_delete(local_188.
                          super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
                          .super_Pass._vptr_Pass,
                          (long)local_188.
                                super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
                                .super_Pass.name._M_dataplus._M_p -
                          (long)local_188.
                                super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
                                .super_Pass._vptr_Pass);
        }
      }
    }
  }
  return (LUBFinder)(Type)a.id;
}

Assistant:

LUBFinder getResultsLUB(Function* func, Module& wasm) {
  LUBFinder lub;

  if (!wasm.features.hasGC()) {
    return lub;
  }

  Type originalType = func->getResults();
  if (!originalType.hasRef()) {
    // Nothing to refine.
    return lub;
  }

  // Before we do anything, we must refinalize the function, because otherwise
  // its body may contain a block with a forced type,
  //
  // (func (result X)
  //  (block (result X)
  //   (..content with more specific type Y..)
  //  )
  ReFinalize().walkFunctionInModule(func, &wasm);

  lub.note(func->body->type);
  if (lub.getLUB() == originalType) {
    return lub;
  }

  // Scan the body and look at the returns. First, return expressions.
  for (auto* ret : FindAll<Return>(func->body).list) {
    lub.note(ret->value->type);
    if (lub.getLUB() == originalType) {
      return lub;
    }
  }

  // Process return_calls and call_refs. Unlike return expressions which we
  // just handled, these only get a type to update, not a value.
  auto processReturnType = [&](Type type) {
    // Return whether we still look ok to do the optimization. If this is
    // false then we can stop here.
    lub.note(type);
    return lub.getLUB() != originalType;
  };

  for (auto* call : FindAll<Call>(func->body).list) {
    if (call->isReturn &&
        !processReturnType(wasm.getFunction(call->target)->getResults())) {
      return lub;
    }
  }
  for (auto* call : FindAll<CallIndirect>(func->body).list) {
    if (call->isReturn &&
        !processReturnType(call->heapType.getSignature().results)) {
      return lub;
    }
  }
  for (auto* call : FindAll<CallRef>(func->body).list) {
    if (call->isReturn) {
      auto targetType = call->target->type;
      if (targetType == Type::unreachable) {
        continue;
      }
      if (!processReturnType(targetType.getHeapType().getSignature().results)) {
        return lub;
      }
    }
  }

  return lub;
}